

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O2

int decoder_get_var(ndn_decoder_t *decoder,uint32_t *var)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  puVar3 = decoder->input_value;
  uVar2 = decoder->offset;
  bVar1 = puVar3[uVar2];
  uVar5 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar4 = 1;
  }
  else {
    uVar6 = decoder->input_size - uVar2;
    if (uVar6 < 3 || bVar1 != 0xfd) {
      if (uVar6 < 5 || uVar5 != 0xfe) {
        return -0xe;
      }
      uVar5 = (uint)puVar3[uVar2 + 4] |
              (uint)puVar3[uVar2 + 3] << 8 |
              (uint)puVar3[uVar2 + 2] << 0x10 | (uint)puVar3[uVar2 + 1] << 0x18;
      iVar4 = 5;
    }
    else {
      uVar5 = (uint)CONCAT11(puVar3[uVar2 + 1],puVar3[uVar2 + 2]);
      iVar4 = 3;
    }
  }
  *var = uVar5;
  decoder->offset = decoder->offset + iVar4;
  return 0;
}

Assistant:

static inline int
decoder_get_var(ndn_decoder_t* decoder, uint32_t* var)
{
  uint8_t first_bit = decoder->input_value[decoder->offset];
  uint32_t rest_size = decoder->input_size - decoder->offset;
  if (first_bit < 253) {
    *var = first_bit;
    decoder->offset += 1;
  }
  else if (first_bit == 253 && rest_size >= 3) {
    *var = ((uint32_t)decoder->input_value[decoder->offset + 1] << 8)
      + decoder->input_value[decoder->offset + 2];
    decoder->offset += 3;
  }
  else if (first_bit == 254 && rest_size >= 5) {
    *var = ((uint32_t)decoder->input_value[decoder->offset + 1] << 24)
      + ((uint32_t)decoder->input_value[decoder->offset + 2] << 16)
      + ((uint32_t)decoder->input_value[decoder->offset + 3] << 8)
      + decoder->input_value[decoder->offset + 4];
    decoder->offset += 5;
  }
  else {
    return NDN_OVERSIZE_VAR;
  }
  return 0;
}